

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APInt.cpp
# Opt level: O2

void __thiscall
llvm::APInt::toString
          (APInt *this,SmallVectorImpl<char> *Str,uint Radix,bool Signed,bool formatAsCLiteral)

{
  void *pvVar1;
  bool bVar2;
  uint uVar3;
  ulong uVar4;
  APInt *pAVar5;
  undefined7 in_register_00000009;
  uint ShiftAmt;
  char *in_start;
  char *Elt;
  ulong RHS;
  uint64_t Digit;
  undefined4 local_7c;
  APInt Tmp;
  char local_38 [8];
  
  if ((0x24 < Radix) || (RHS = (ulong)Radix, (0x1000010504U >> (RHS & 0x3f) & 1) == 0)) {
    __assert_fail("(Radix == 10 || Radix == 8 || Radix == 16 || Radix == 2 || Radix == 36) && \"Radix should be 2, 8, 10, 16, or 36!\""
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APInt.cpp"
                  ,0x7e2,
                  "void llvm::APInt::toString(SmallVectorImpl<char> &, unsigned int, bool, bool) const"
                 );
  }
  if (formatAsCLiteral) {
    if ((0xf < Radix - 2) || (uVar3 = Radix - 2 >> 1, (0x99U >> (uVar3 & 0x1f) & 1) == 0)) {
      llvm_unreachable_internal
                ("Invalid radix!",
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APInt.cpp"
                 ,0x7f5);
    }
    Elt = &DAT_001c9170 + *(int *)(&DAT_001c9170 + (ulong)uVar3 * 4);
  }
  else {
    Elt = "";
  }
  bVar2 = operator==(this,0);
  if (bVar2) {
    for (; *Elt != '\0'; Elt = Elt + 1) {
      SmallVectorTemplateBase<char,_true>::push_back
                (&Str->super_SmallVectorTemplateBase<char,_true>,Elt);
    }
    Tmp.U.VAL._0_1_ = 0x30;
    SmallVectorTemplateBase<char,_true>::push_back
              (&Str->super_SmallVectorTemplateBase<char,_true>,(char *)&Tmp);
    return;
  }
  if (this->BitWidth < 0x41) {
    if (Signed) {
      uVar4 = getSExtValue(this);
      if ((long)uVar4 < 0) {
        Digit._0_1_ = 0x2d;
        SmallVectorTemplateBase<char,_true>::push_back
                  (&Str->super_SmallVectorTemplateBase<char,_true>,(char *)&Digit);
        uVar4 = -uVar4;
      }
    }
    else {
      uVar4 = getZExtValue(this);
    }
    for (; in_start = local_38 + 1, *Elt != '\0'; Elt = Elt + 1) {
      SmallVectorTemplateBase<char,_true>::push_back
                (&Str->super_SmallVectorTemplateBase<char,_true>,Elt);
    }
    for (; uVar4 != 0; uVar4 = uVar4 / RHS) {
      in_start[-1] = "0123456789ABCDEFGHIJKLMNOPQRSTUVWXYZ"[uVar4 % RHS];
      in_start = in_start + -1;
    }
    SmallVectorImpl<char>::append<char*,void>(Str,in_start,local_38 + 1);
    return;
  }
  local_7c = (undefined4)CONCAT71(in_register_00000009,Signed);
  APInt(&Tmp,this);
  if (((char)local_7c != '\0') && (bVar2 = isNegative(this), bVar2)) {
    negate(&Tmp);
    Digit._0_1_ = 0x2d;
    SmallVectorTemplateBase<char,_true>::push_back
              (&Str->super_SmallVectorTemplateBase<char,_true>,(char *)&Digit);
  }
  for (; *Elt != '\0'; Elt = Elt + 1) {
    SmallVectorTemplateBase<char,_true>::push_back
              (&Str->super_SmallVectorTemplateBase<char,_true>,Elt);
  }
  uVar3 = (Str->super_SmallVectorTemplateBase<char,_true>).
          super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.Size;
  if ((Radix == 2) || (Radix == 8)) {
    ShiftAmt = (uint)(Radix == 8) * 2 + 1;
  }
  else {
    if (Radix != 0x10) {
      while (bVar2 = getBoolValue(&Tmp), bVar2) {
        udivrem(&Tmp,RHS,&Tmp,&Digit);
        if (RHS <= CONCAT71(Digit._1_7_,(undefined1)Digit)) {
          __assert_fail("Digit < Radix && \"divide failed\"",
                        "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APInt.cpp"
                        ,0x846,
                        "void llvm::APInt::toString(SmallVectorImpl<char> &, unsigned int, bool, bool) const"
                       );
        }
        SmallVectorTemplateBase<char,_true>::push_back
                  (&Str->super_SmallVectorTemplateBase<char,_true>,
                   "0123456789ABCDEFGHIJKLMNOPQRSTUVWXYZ" + CONCAT71(Digit._1_7_,(undefined1)Digit))
        ;
      }
      goto LAB_00162423;
    }
    ShiftAmt = 4;
  }
  while (bVar2 = getBoolValue(&Tmp), bVar2) {
    pAVar5 = &Tmp;
    if (0x40 < Tmp.BitWidth) {
      pAVar5 = (APInt *)CONCAT71(Tmp.U.VAL._1_7_,Tmp.U.VAL._0_1_);
    }
    SmallVectorTemplateBase<char,_true>::push_back
              (&Str->super_SmallVectorTemplateBase<char,_true>,
               "0123456789ABCDEFGHIJKLMNOPQRSTUVWXYZ" + (*(uint *)&pAVar5->U & Radix - 1));
    lshrInPlace(&Tmp,ShiftAmt);
  }
LAB_00162423:
  pvVar1 = (Str->super_SmallVectorTemplateBase<char,_true>).
           super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.BeginX;
  std::__reverse<char*>
            ((ulong)uVar3 + (long)pvVar1,
             (ulong)(Str->super_SmallVectorTemplateBase<char,_true>).
                    super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.Size +
             (long)pvVar1);
  ~APInt(&Tmp);
  return;
}

Assistant:

void APInt::toString(SmallVectorImpl<char> &Str, unsigned Radix,
                     bool Signed, bool formatAsCLiteral) const {
  assert((Radix == 10 || Radix == 8 || Radix == 16 || Radix == 2 ||
          Radix == 36) &&
         "Radix should be 2, 8, 10, 16, or 36!");

  const char *Prefix = "";
  if (formatAsCLiteral) {
    switch (Radix) {
      case 2:
        // Binary literals are a non-standard extension added in gcc 4.3:
        // http://gcc.gnu.org/onlinedocs/gcc-4.3.0/gcc/Binary-constants.html
        Prefix = "0b";
        break;
      case 8:
        Prefix = "0";
        break;
      case 10:
        break; // No prefix
      case 16:
        Prefix = "0x";
        break;
      default:
        llvm_unreachable("Invalid radix!");
    }
  }

  // First, check for a zero value and just short circuit the logic below.
  if (*this == 0) {
    while (*Prefix) {
      Str.push_back(*Prefix);
      ++Prefix;
    };
    Str.push_back('0');
    return;
  }

  static const char Digits[] = "0123456789ABCDEFGHIJKLMNOPQRSTUVWXYZ";

  if (isSingleWord()) {
    char Buffer[65];
    char *BufPtr = std::end(Buffer);

    uint64_t N;
    if (!Signed) {
      N = getZExtValue();
    } else {
      int64_t I = getSExtValue();
      if (I >= 0) {
        N = I;
      } else {
        Str.push_back('-');
        N = -(uint64_t)I;
      }
    }

    while (*Prefix) {
      Str.push_back(*Prefix);
      ++Prefix;
    };

    while (N) {
      *--BufPtr = Digits[N % Radix];
      N /= Radix;
    }
    Str.append(BufPtr, std::end(Buffer));
    return;
  }

  APInt Tmp(*this);

  if (Signed && isNegative()) {
    // They want to print the signed version and it is a negative value
    // Flip the bits and add one to turn it into the equivalent positive
    // value and put a '-' in the result.
    Tmp.negate();
    Str.push_back('-');
  }

  while (*Prefix) {
    Str.push_back(*Prefix);
    ++Prefix;
  };

  // We insert the digits backward, then reverse them to get the right order.
  unsigned StartDig = Str.size();

  // For the 2, 8 and 16 bit cases, we can just shift instead of divide
  // because the number of bits per digit (1, 3 and 4 respectively) divides
  // equally.  We just shift until the value is zero.
  if (Radix == 2 || Radix == 8 || Radix == 16) {
    // Just shift tmp right for each digit width until it becomes zero
    unsigned ShiftAmt = (Radix == 16 ? 4 : (Radix == 8 ? 3 : 1));
    unsigned MaskAmt = Radix - 1;

    while (Tmp.getBoolValue()) {
      unsigned Digit = unsigned(Tmp.getRawData()[0]) & MaskAmt;
      Str.push_back(Digits[Digit]);
      Tmp.lshrInPlace(ShiftAmt);
    }
  } else {
    while (Tmp.getBoolValue()) {
      uint64_t Digit;
      udivrem(Tmp, Radix, Tmp, Digit);
      assert(Digit < Radix && "divide failed");
      Str.push_back(Digits[Digit]);
    }
  }

  // Reverse the digits before returning.
  std::reverse(Str.begin()+StartDig, Str.end());
}